

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

void soul::Optimisations::recursivelyFlagStructUse(Type *type)

{
  Structure *pSVar1;
  Member *m;
  Member *type_00;
  long lVar2;
  Type TStack_28;
  
  if (type->category == array) {
    Type::getArrayElementType(&TStack_28,type);
    recursivelyFlagStructUse(&TStack_28);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_28.structure);
  }
  else if (type->category == structure) {
    pSVar1 = Type::getStructRef(type);
    if (pSVar1->activeUseFlag == false) {
      pSVar1 = Type::getStructRef(type);
      pSVar1->activeUseFlag = true;
      pSVar1 = Type::getStructRef(type);
      type_00 = (pSVar1->members).items;
      for (lVar2 = (pSVar1->members).numActive << 6; lVar2 != 0; lVar2 = lVar2 + -0x40) {
        recursivelyFlagStructUse(&type_00->type);
        type_00 = type_00 + 1;
      }
    }
  }
  return;
}

Assistant:

static void recursivelyFlagStructUse (const Type& type)
    {
        if (type.isStruct())
        {
            if (! type.getStructRef().activeUseFlag)
            {
                type.getStructRef().activeUseFlag = true;

                for (auto& m : type.getStructRef().getMembers())
                    recursivelyFlagStructUse (m.type);
            }
        }
        else if (type.isArray())
        {
            recursivelyFlagStructUse (type.getArrayElementType());
        }
    }